

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int x9_62_create_key_exchange
              (ptls_key_exchange_algorithm_t *algo,ptls_key_exchange_context_t **_ctx)

{
  EC_KEY *pEVar1;
  int local_2c;
  st_x9_62_keyex_context_t *psStack_28;
  int ret;
  st_x9_62_keyex_context_t *ctx;
  EC_GROUP *group;
  ptls_key_exchange_context_t **_ctx_local;
  ptls_key_exchange_algorithm_t *algo_local;
  
  ctx = (st_x9_62_keyex_context_t *)0x0;
  psStack_28 = (st_x9_62_keyex_context_t *)0x0;
  group = (EC_GROUP *)_ctx;
  _ctx_local = (ptls_key_exchange_context_t **)algo;
  ctx = (st_x9_62_keyex_context_t *)EC_GROUP_new_by_curve_name((int)algo->data);
  if (ctx == (st_x9_62_keyex_context_t *)0x0) {
    local_2c = 0x203;
  }
  else {
    local_2c = x9_62_create_context
                         ((ptls_key_exchange_algorithm_t *)_ctx_local,&stack0xffffffffffffffd8);
    if (local_2c == 0) {
      pEVar1 = ecdh_gerenate_key((EC_GROUP *)ctx);
      psStack_28->privkey = pEVar1;
      if (pEVar1 == (EC_KEY *)0x0) {
        local_2c = 0x203;
      }
      else {
        local_2c = x9_62_setup_pubkey(psStack_28);
        if (local_2c == 0) {
          local_2c = 0;
        }
      }
    }
  }
  if (ctx != (st_x9_62_keyex_context_t *)0x0) {
    EC_GROUP_free((EC_GROUP *)ctx);
  }
  if (local_2c == 0) {
    *(st_x9_62_keyex_context_t **)group = psStack_28;
  }
  else {
    if (psStack_28 != (st_x9_62_keyex_context_t *)0x0) {
      x9_62_free_context(psStack_28);
    }
    *(undefined8 *)group = 0;
  }
  return local_2c;
}

Assistant:

static int x9_62_create_key_exchange(ptls_key_exchange_algorithm_t *algo, ptls_key_exchange_context_t **_ctx)
{
    EC_GROUP* group = NULL;
    struct st_x9_62_keyex_context_t *ctx = NULL;
    int ret;

    /* FIXME use a global? */
    if ((group = EC_GROUP_new_by_curve_name((int)algo->data)) == NULL) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    if ((ret = x9_62_create_context(algo, &ctx)) != 0)
        goto Exit;
    if ((ctx->privkey = ecdh_gerenate_key(group)) == NULL) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    if ((ret = x9_62_setup_pubkey(ctx)) != 0)
        goto Exit;
    ret = 0;

Exit:
    if (group != NULL)
        EC_GROUP_free(group);
    if (ret == 0) {
        *_ctx = &ctx->super;
    } else {
        if (ctx != NULL)
            x9_62_free_context(ctx);
        *_ctx = NULL;
    }

    return ret;
}